

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbolic_invert.cc
# Opt level: O0

void ipx::SymbolicInvert(Model *model,vector<int,_std::allocator<int>_> *basis,Int *rowcounts,
                        Int *colcounts)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first_00;
  bool bVar1;
  Int IVar2;
  size_type sVar3;
  Int *pIVar4;
  Int *pIVar5;
  int *piVar6;
  reference pvVar7;
  reference pvVar8;
  reference piVar9;
  const_reference pvVar10;
  vector<int,_std::allocator<int>_> *this;
  int *work_00;
  long in_RCX;
  long in_RDX;
  vector<int,_std::allocator<int>_> *in_RSI;
  Model *in_RDI;
  Int i_1;
  iterator __end3_1;
  iterator __begin3_1;
  value_type *__range3_1;
  Int t_1;
  Int nz_1;
  Int top_1;
  Int b_1;
  Int *Ci_1;
  Int *Cp_1;
  Int p;
  Int i;
  iterator __end3;
  iterator __begin3;
  value_type *__range3;
  Int t;
  Int nz;
  Int top;
  Int b;
  Int *Ci;
  Int *Cp;
  vector<int,_std::allocator<int>_> jcount;
  vector<int,_std::allocator<int>_> work;
  vector<int,_std::allocator<int>_> marked;
  vector<int,_std::allocator<int>_> stack;
  Int nb;
  SparseMatrix C;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  blocks;
  SparseMatrix BT;
  vector<int,_std::allocator<int>_> jmatch;
  Int m;
  SparseMatrix *AI;
  SparseMatrix *in_stack_fffffffffffffb08;
  Int in_stack_fffffffffffffb10;
  undefined4 in_stack_fffffffffffffb14;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffb18;
  undefined4 in_stack_fffffffffffffb20;
  Int in_stack_fffffffffffffb24;
  SparseMatrix *in_stack_fffffffffffffb28;
  undefined4 in_stack_fffffffffffffb30;
  undefined4 in_stack_fffffffffffffb34;
  int iVar11;
  undefined4 in_stack_fffffffffffffb58;
  undefined4 in_stack_fffffffffffffb5c;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffb60;
  SparseMatrix *in_stack_fffffffffffffb68;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *in_stack_fffffffffffffc00;
  SparseMatrix *in_stack_fffffffffffffc08;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_3b0;
  reference local_3a8;
  int local_3a0;
  int local_39c;
  Int local_398;
  int local_394;
  Int *local_390;
  Int *local_388;
  undefined4 local_37c;
  int *local_378;
  int *local_370;
  int local_2e8;
  int local_2e4;
  int *local_2e0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffd28;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd3c;
  int iVar12;
  Int local_2bc;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffd48;
  Int *pIVar13;
  Model *in_stack_fffffffffffffd50;
  Int *pIVar14;
  vector<int,_std::allocator<int>_> local_288 [4];
  vector<int,_std::allocator<int>_> local_228;
  int local_20c;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_188 [13];
  vector<int,_std::allocator<int>_> local_48;
  Int local_2c;
  SparseMatrix *local_28;
  long local_20;
  long local_18;
  vector<int,_std::allocator<int>_> *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_28 = Model::AI(in_RDI);
  local_2c = SparseMatrix::rows(local_28);
  RandomPermute((vector<int,_std::allocator<int>_> *)
                CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
  Matching(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
  CopyColumns(in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
  Transpose(in_stack_fffffffffffffb28);
  SparseMatrix::operator=
            ((SparseMatrix *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),
             in_stack_fffffffffffffb08);
  SparseMatrix::~SparseMatrix
            ((SparseMatrix *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10));
  Blockperm((SparseMatrix *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
            in_stack_fffffffffffffd30,(SparseMatrix *)in_stack_fffffffffffffd28._M_current);
  CoarsenedGraph(in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
  sVar3 = std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::size(local_188);
  local_20c = (int)sVar3;
  std::allocator<int>::allocator((allocator<int> *)0x851550);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
             (size_type)in_stack_fffffffffffffb28,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
  std::allocator<int>::~allocator((allocator<int> *)0x85157c);
  std::allocator<int>::allocator((allocator<int> *)0x8515a1);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
             (size_type)in_stack_fffffffffffffb28,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
  std::allocator<int>::~allocator((allocator<int> *)0x8515cd);
  std::allocator<int>::allocator((allocator<int> *)0x8515f2);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
             (size_type)in_stack_fffffffffffffb28,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
  std::allocator<int>::~allocator((allocator<int> *)0x85161e);
  if (local_18 != 0) {
    SparseMatrix::cols((SparseMatrix *)0x85163a);
    std::allocator<int>::allocator((allocator<int> *)0x851674);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
               (size_type)in_stack_fffffffffffffb28,
               (value_type_conflict2 *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20)
               ,(allocator_type *)in_stack_fffffffffffffb18._M_current);
    std::allocator<int>::~allocator((allocator<int> *)0x8516a8);
    std::vector<int,_std::allocator<int>_>::begin
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb08);
    std::vector<int,_std::allocator<int>_>::end
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb08);
    __first._M_current._4_4_ = in_stack_fffffffffffffb24;
    __first._M_current._0_4_ = in_stack_fffffffffffffb20;
    std::fill<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
              (__first,in_stack_fffffffffffffb18,
               (int *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10));
    pIVar4 = SparseMatrix::colptr((SparseMatrix *)0x851711);
    pIVar5 = SparseMatrix::rowidx((SparseMatrix *)0x851738);
    for (local_2bc = 0; iVar12 = local_20c, local_2bc < local_20c; local_2bc = local_2bc + 1) {
      pIVar13 = pIVar5;
      pIVar14 = pIVar4;
      piVar6 = std::vector<int,_std::allocator<int>_>::data
                         ((vector<int,_std::allocator<int>_> *)0x8517ba);
      in_stack_fffffffffffffb08 =
           (SparseMatrix *)
           std::vector<int,_std::allocator<int>_>::data
                     ((vector<int,_std::allocator<int>_> *)0x8517cf);
      in_stack_fffffffffffffb18._M_current =
           std::vector<int,_std::allocator<int>_>::data
                     ((vector<int,_std::allocator<int>_> *)0x8517ef);
      in_stack_fffffffffffffb10 = local_2bc;
      IVar2 = DepthFirstSearch(local_2bc,pIVar4,pIVar5,(Int *)0x0,iVar12,piVar6,
                               (Int *)in_stack_fffffffffffffb08,local_2bc,
                               in_stack_fffffffffffffb18._M_current);
      iVar12 = 0;
      pIVar5 = pIVar13;
      pIVar4 = pIVar14;
      for (; IVar2 < local_20c; IVar2 = IVar2 + 1) {
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&local_228,(long)IVar2);
        pvVar8 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[](local_188,(long)*pvVar7);
        sVar3 = std::vector<int,_std::allocator<int>_>::size(pvVar8);
        iVar12 = iVar12 + (int)sVar3;
      }
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::operator[](local_188,(long)local_2bc);
      std::vector<int,_std::allocator<int>_>::begin
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb08);
      local_2e0 = (int *)std::vector<int,_std::allocator<int>_>::end
                                   ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb08);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *
                                )CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),
                                (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *
                                )in_stack_fffffffffffffb08), bVar1) {
        piVar9 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                           &stack0xfffffffffffffd28);
        local_2e4 = *piVar9;
        iVar11 = iVar12;
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&local_48,(long)local_2e4);
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](local_288,(long)*pvVar7);
        *pvVar7 = iVar12;
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                   &stack0xfffffffffffffd28);
        iVar12 = iVar11;
      }
    }
    for (local_2e8 = 0; local_2e8 < local_2c; local_2e8 = local_2e8 + 1) {
      pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](local_10,(long)local_2e8);
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](local_288,(long)*pvVar10);
      *(value_type *)(local_18 + (long)local_2e8 * 4) = *pvVar7;
    }
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
  }
  if (local_20 != 0) {
    Transpose(in_stack_fffffffffffffb28);
    SparseMatrix::operator=
              ((SparseMatrix *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),
               in_stack_fffffffffffffb08);
    SparseMatrix::~SparseMatrix
              ((SparseMatrix *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10));
    local_370 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                 ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb08);
    local_378 = (int *)std::vector<int,_std::allocator<int>_>::end
                                 ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb08);
    local_37c = 0xffffffff;
    __first_00._M_current._4_4_ = in_stack_fffffffffffffb24;
    __first_00._M_current._0_4_ = in_stack_fffffffffffffb20;
    std::fill<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
              (__first_00,in_stack_fffffffffffffb18,
               (int *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10));
    local_388 = SparseMatrix::colptr((SparseMatrix *)0x851c15);
    local_390 = SparseMatrix::rowidx((SparseMatrix *)0x851c36);
    for (local_394 = 0; iVar12 = local_20c, pIVar4 = local_388, pIVar5 = local_390,
        local_394 < local_20c; local_394 = local_394 + 1) {
      iVar11 = local_394;
      piVar6 = std::vector<int,_std::allocator<int>_>::data
                         ((vector<int,_std::allocator<int>_> *)0x851ca6);
      this = (vector<int,_std::allocator<int>_> *)
             std::vector<int,_std::allocator<int>_>::data
                       ((vector<int,_std::allocator<int>_> *)0x851cb8);
      in_stack_fffffffffffffb10 = local_394;
      work_00 = std::vector<int,_std::allocator<int>_>::data
                          ((vector<int,_std::allocator<int>_> *)0x851cd5);
      in_stack_fffffffffffffb24 = in_stack_fffffffffffffb10;
      local_3a0 = DepthFirstSearch(iVar11,pIVar4,pIVar5,(Int *)0x0,iVar12,piVar6,(Int *)this,
                                   in_stack_fffffffffffffb10,work_00);
      local_39c = 0;
      local_398 = local_3a0;
      for (; local_3a0 < local_20c; local_3a0 = local_3a0 + 1) {
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&local_228,(long)local_3a0);
        pvVar8 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[](local_188,(long)*pvVar7);
        sVar3 = std::vector<int,_std::allocator<int>_>::size(pvVar8);
        local_39c = local_39c + (int)sVar3;
      }
      local_3a8 = std::
                  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ::operator[](local_188,(long)local_394);
      local_3b0._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(this);
      std::vector<int,_std::allocator<int>_>::end(this);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *
                                )CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),
                                (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *
                                )this), bVar1) {
        piVar9 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&local_3b0);
        *(int *)(local_20 + (long)*piVar9 * 4) = local_39c;
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&local_3b0);
      }
    }
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
  SparseMatrix::~SparseMatrix
            ((SparseMatrix *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10));
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
  SparseMatrix::~SparseMatrix
            ((SparseMatrix *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10));
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
  return;
}

Assistant:

void SymbolicInvert(const Model& model, const std::vector<Int>& basis,
                    Int* rowcounts, Int* colcounts) {
    const SparseMatrix& AI = model.AI();
    const Int m = AI.rows();
    assert((Int)basis.size() == m);

    // jmatch is a permutation of basis such that B = AI[:,jmatch] has a
    // zero-free diagonal.
    std::vector<Int> jmatch = Matching(model, RandomPermute(basis));
    SparseMatrix BT = CopyColumns(AI, jmatch);
    BT = Transpose(BT);

    std::vector<std::vector<Int> > blocks = Blockperm(AI, jmatch, BT);
    SparseMatrix C = CoarsenedGraph(BT, blocks);

    const Int nb = blocks.size();
    std::vector<Int> stack(nb), marked(nb), work(nb);

    if (rowcounts) {
        std::vector<Int> jcount(AI.cols(), -1);
        std::fill(marked.begin(), marked.end(), -1);
        const Int* Cp = C.colptr();
        const Int* Ci = C.rowidx();
        for (Int b = 0; b < nb; b++) {
            Int top = DepthFirstSearch(b, Cp, Ci, nullptr, nb, stack.data(),
                                       marked.data(), b, work.data());
            Int nz = 0;
            for (Int t = top; t < nb; t++)
                nz += blocks[stack[t]].size();
            for (Int i : blocks[b])
                jcount[jmatch[i]] = nz;
        }
        for (Int p = 0; p < m; p++) {
            rowcounts[p] = jcount[basis[p]];
            assert(rowcounts[p] >= 0);
        }
    }

    if (colcounts) {
        C = Transpose(C);
        std::fill(marked.begin(), marked.end(), -1);
        const Int* Cp = C.colptr();
        const Int* Ci = C.rowidx();
        for (Int b = 0; b < nb; b++) {
            Int top = DepthFirstSearch(b, Cp, Ci, nullptr, nb, stack.data(),
                                       marked.data(), b, work.data());
            Int nz = 0;
            for (Int t = top; t < nb; t++)
                nz += blocks[stack[t]].size();
            for (Int i : blocks[b])
                colcounts[i] = nz;
        }
    }
}